

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void V_InitCustomFonts(void)

{
  byte bVar1;
  bool bVar2;
  uint lump;
  FTextureID FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FTexture *pFVar7;
  long lVar8;
  FSpecialFont *this;
  ulong uVar9;
  char local_a6d;
  int local_a6c;
  FString namebuffer;
  int local_a5c;
  FString templatebuf;
  int lastlump;
  ulong local_a48;
  ulong local_a40;
  FScanner sc;
  bool notranslate [256];
  FTexture *lumplist [256];
  
  FScanner::FScanner(&sc);
  namebuffer.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  lastlump = 0;
  templatebuf.Chars = FString::NullString.Nothing;
  local_a6d = '_';
  do {
    lump = FWadCollection::FindLump(&Wads,"FONTDEFS",&lastlump,false);
    if (lump == 0xffffffff) {
LAB_0048a3fc:
      FString::~FString(&templatebuf);
      FString::~FString(&namebuffer);
      FScanner::~FScanner(&sc);
      return;
    }
    FScanner::OpenLumpNum(&sc,lump);
    local_a48 = (ulong)lump;
LAB_0048a03d:
    bVar2 = FScanner::GetString(&sc);
    if (bVar2) {
      memset(lumplist,0,0x800);
      memset(notranslate,0,0x100);
      FString::operator=(&namebuffer,sc.String);
      FScanner::MustGetStringName(&sc,"{");
      iVar5 = 0;
      local_a5c = 0xdf;
      local_a6c = 0x21;
      local_a40 = 0xffffffffffffffff;
      iVar6 = 0x21;
      while (bVar2 = FScanner::CheckString(&sc,"}"), !bVar2) {
        FScanner::MustGetString(&sc);
        bVar2 = FScanner::Compare(&sc,"TEMPLATE");
        if (bVar2) {
          if (iVar5 == 2) goto LAB_0048a3e4;
          FScanner::MustGetString(&sc);
          FString::operator=(&templatebuf,sc.String);
          iVar5 = 1;
        }
        else {
          bVar2 = FScanner::Compare(&sc,"BASE");
          if (bVar2) {
            if (iVar5 == 2) goto LAB_0048a3e4;
            FScanner::MustGetNumber(&sc);
            iVar5 = 1;
            iVar6 = sc.Number;
          }
          else {
            bVar2 = FScanner::Compare(&sc,"FIRST");
            if (bVar2) {
              if (iVar5 == 2) goto LAB_0048a3e4;
              FScanner::MustGetNumber(&sc);
              local_a6c = sc.Number;
              iVar5 = 1;
            }
            else {
              bVar2 = FScanner::Compare(&sc,"COUNT");
              if (bVar2) {
                if (iVar5 == 2) goto LAB_0048a3e4;
                FScanner::MustGetNumber(&sc);
                local_a5c = sc.Number;
                iVar5 = 1;
              }
              else {
                bVar2 = FScanner::Compare(&sc,"CURSOR");
                if (bVar2) {
                  FScanner::MustGetString(&sc);
                  local_a6d = *sc.String;
                }
                else {
                  bVar2 = FScanner::Compare(&sc,"SPACEWIDTH");
                  if (bVar2) {
                    if (iVar5 == 2) goto LAB_0048a3e4;
                    FScanner::MustGetNumber(&sc);
                    local_a40 = (ulong)(uint)sc.Number;
                    iVar5 = 1;
                  }
                  else {
                    bVar2 = FScanner::Compare(&sc,"NOTRANSLATION");
                    if (bVar2) {
                      if (iVar5 == 1) goto LAB_0048a3e4;
                      while ((bVar2 = FScanner::CheckNumber(&sc), bVar2 && ((sc.Crossed & 1U) == 0))
                            ) {
                        if ((ulong)(uint)sc.Number < 0x100) {
                          notranslate[(uint)sc.Number] = true;
                        }
                      }
LAB_0048a2e3:
                      iVar5 = 2;
                    }
                    else {
                      if (iVar5 == 1) goto LAB_0048a3e4;
                      bVar1 = *sc.String;
                      FScanner::MustGetString(&sc);
                      FVar3 = FTextureManager::CheckForTexture(&TexMan,sc.String,8,1);
                      if (-1 < FVar3.texnum) {
                        if ((uint)FVar3.texnum < TexMan.Textures.Count) {
                          pFVar7 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
                        }
                        else {
                          pFVar7 = (FTexture *)0x0;
                        }
                        lumplist[bVar1] = pFVar7;
                        goto LAB_0048a2e3;
                      }
                      iVar4 = FWadCollection::GetLumpFile(&Wads,sc.LumpNum);
                      iVar5 = 2;
                      if (0 < iVar4) {
                        FScanner::ScriptMessage
                                  (&sc,"%s: Unable to find texture in font definition for %s",
                                   sc.String,namebuffer.Chars);
                        iVar5 = 2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (iVar5 == 1) {
        this = (FSpecialFont *)operator_new(0x60);
        FFont::FFont((FFont *)this,namebuffer.Chars,templatebuf.Chars,local_a6c,local_a5c,iVar6,
                     (int)local_a48,(int)local_a40);
        goto LAB_0048a3ca;
      }
      if (iVar5 == 2) break;
LAB_0048a3e4:
      FScanner::ScriptError(&sc,"Invalid combination of properties in font \'%s\'",namebuffer.Chars)
      ;
      goto LAB_0048a3fc;
    }
    FScanner::Close(&sc);
  } while( true );
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    if (lumplist[lVar8] != (FTexture *)0x0) {
      local_a6c = (int)lVar8;
      break;
    }
  }
  iVar5 = 0x100 - local_a6c;
  for (uVar9 = 0xff;
      (iVar6 = local_a5c, -1 < (int)uVar9 && (iVar6 = iVar5, lumplist[uVar9] == (FTexture *)0x0));
      uVar9 = (ulong)((int)uVar9 - 1)) {
    iVar5 = iVar5 + -1;
  }
  if (0 < iVar6) {
    this = (FSpecialFont *)operator_new(0x160);
    FSpecialFont::FSpecialFont
              (this,namebuffer.Chars,local_a6c,iVar6,lumplist + local_a6c,notranslate,(int)local_a48
              );
LAB_0048a3ca:
    (this->super_FFont).Cursor = local_a6d;
  }
  goto LAB_0048a03d;
}

Assistant:

void V_InitCustomFonts()
{
	FScanner sc;
	FTexture *lumplist[256];
	bool notranslate[256];
	FString namebuffer, templatebuf;
	int i;
	int llump,lastlump=0;
	int format;
	int start;
	int first;
	int count;
	int spacewidth;
	char cursor = '_';

	while ((llump = Wads.FindLump ("FONTDEFS", &lastlump)) != -1)
	{
		sc.OpenLumpNum(llump);
		while (sc.GetString())
		{
			memset (lumplist, 0, sizeof(lumplist));
			memset (notranslate, 0, sizeof(notranslate));
			namebuffer = sc.String;
			format = 0;
			start = 33;
			first = 33;
			count = 223;
			spacewidth = -1;

			sc.MustGetStringName ("{");
			while (!sc.CheckString ("}"))
			{
				sc.MustGetString();
				if (sc.Compare ("TEMPLATE"))
				{
					if (format == 2) goto wrong;
					sc.MustGetString();
					templatebuf = sc.String;
					format = 1;
				}
				else if (sc.Compare ("BASE"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					start = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("FIRST"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					first = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("COUNT"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					count = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("CURSOR"))
				{
					sc.MustGetString();
					cursor = sc.String[0];
				}
				else if (sc.Compare ("SPACEWIDTH"))
				{
					if (format == 2) goto wrong;
					sc.MustGetNumber();
					spacewidth = sc.Number;
					format = 1;
				}
				else if (sc.Compare ("NOTRANSLATION"))
				{
					if (format == 1) goto wrong;
					while (sc.CheckNumber() && !sc.Crossed)
					{
						if (sc.Number >= 0 && sc.Number < 256)
							notranslate[sc.Number] = true;
					}
					format = 2;
				}
				else
				{
					if (format == 1) goto wrong;
					FTexture **p = &lumplist[*(unsigned char*)sc.String];
					sc.MustGetString();
					FTextureID texid = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
					if (texid.Exists())
					{
						*p = TexMan[texid];
					}
					else if (Wads.GetLumpFile(sc.LumpNum) >= Wads.IWAD_FILENUM)
					{
						// Print a message only if this isn't in zdoom.pk3
						sc.ScriptMessage("%s: Unable to find texture in font definition for %s", sc.String, namebuffer.GetChars());
					}
					format = 2;
				}
			}
			if (format == 1)
			{
				FFont *fnt = new FFont (namebuffer, templatebuf, first, count, start, llump, spacewidth);
				fnt->SetCursor(cursor);
			}
			else if (format == 2)
			{
				for (i = 0; i < 256; i++)
				{
					if (lumplist[i] != NULL)
					{
						first = i;
						break;
					}
				}
				for (i = 255; i >= 0; i--)
				{
					if (lumplist[i] != NULL)
					{
						count = i - first + 1;
						break;
					}
				}
				if (count > 0)
				{
					FFont *fnt = new FSpecialFont (namebuffer, first, count, &lumplist[first], notranslate, llump);
					fnt->SetCursor(cursor);
				}
			}
			else goto wrong;
		}
		sc.Close();
	}
	return;

wrong:
	sc.ScriptError ("Invalid combination of properties in font '%s'", namebuffer.GetChars());
}